

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O2

bool __thiscall QEvdevKeyboardHandler::loadKeymap(QEvdevKeyboardHandler *this,QString *file)

{
  char cVar1;
  undefined8 uVar2;
  QDataStream *pQVar3;
  Mapping *pMVar4;
  Composing *pCVar5;
  bool bVar6;
  quint32 i_1;
  ulong uVar7;
  Mapping *m;
  Composing *c;
  char *pcVar8;
  quint32 i;
  ulong uVar9;
  long in_FS_OFFSET;
  char local_98 [24];
  char *local_80;
  quint32 qmap_keycompose_size;
  quint32 qmap_keymap_size;
  quint32 qmap_version;
  quint32 qmap_magic;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::qLcEvdevKey();
  if (((byte)QtPrivateLogging::qLcEvdevKey::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_44 = 0;
    local_40 = QtPrivateLogging::qLcEvdevKey::category.name;
    uVar2 = QString::utf16();
    QMessageLogger::debug((char *)&local_58,"Loading keymap %ls",uVar2);
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68,(QString *)file);
  cVar1 = QFile::open((QFile *)&local_68,1);
  if (cVar1 == '\0') {
    local_58 = 2;
    local_44 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_40 = "default";
    uVar2 = QString::utf16();
    bVar6 = false;
    QMessageLogger::warning((char *)&local_58,"Could not open keymap file \'%ls\'",uVar2);
    goto LAB_001252cb;
  }
  qmap_magic = 0xaaaaaaaa;
  qmap_version = 0xaaaaaaaa;
  qmap_keymap_size = 0xaaaaaaaa;
  qmap_keycompose_size = 0xaaaaaaaa;
  uStack_48 = 0xaaaaaaaa;
  local_44 = 0xaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,(QIODevice *)&local_68);
  pQVar3 = (QDataStream *)QDataStream::operator>>((QDataStream *)&local_58,(int *)&qmap_magic);
  pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,(int *)&qmap_version);
  pQVar3 = (QDataStream *)QDataStream::operator>>(pQVar3,(int *)&qmap_keymap_size);
  QDataStream::operator>>(pQVar3,(int *)&qmap_keycompose_size);
  if ((((uStack_48._3_1_ == '\0') && (qmap_magic == 0x514d4150)) && (qmap_version == 1)) &&
     (uVar7 = (ulong)qmap_keymap_size, qmap_keymap_size != 0)) {
    pMVar4 = (Mapping *)operator_new__(uVar7 * 0xc);
    if ((ulong)qmap_keycompose_size == 0) {
      pCVar5 = (Composing *)0x0;
    }
    else {
      pCVar5 = (Composing *)operator_new__((ulong)qmap_keycompose_size * 6);
    }
    m = pMVar4;
    for (uVar9 = 0; uVar9 < uVar7; uVar9 = uVar9 + 1) {
      operator>>((QDataStream *)&local_58,m);
      uVar7 = (ulong)qmap_keymap_size;
      m = m + 1;
    }
    c = pCVar5;
    for (uVar7 = 0; uVar7 < qmap_keycompose_size; uVar7 = uVar7 + 1) {
      operator>>((QDataStream *)&local_58,c);
      c = c + 1;
    }
    if (uStack_48._3_1_ != '\0') {
      operator_delete__(pMVar4);
      if (pCVar5 != (Composing *)0x0) {
        operator_delete__(pCVar5);
      }
      local_98[0] = '\x02';
      local_98[1] = '\0';
      local_98[2] = '\0';
      local_98[3] = '\0';
      local_98[0x14] = '\0';
      local_98[0x15] = '\0';
      local_98[0x16] = '\0';
      local_98[0x17] = '\0';
      local_98[4] = '\0';
      local_98[5] = '\0';
      local_98[6] = '\0';
      local_98[7] = '\0';
      local_98[8] = '\0';
      local_98[9] = '\0';
      local_98[10] = '\0';
      local_98[0xb] = '\0';
      local_98[0xc] = '\0';
      local_98[0xd] = '\0';
      local_98[0xe] = '\0';
      local_98[0xf] = '\0';
      local_98[0x10] = '\0';
      local_98[0x11] = '\0';
      local_98[0x12] = '\0';
      local_98[0x13] = '\0';
      local_80 = "default";
      uVar2 = QString::utf16();
      pcVar8 = "Keymap file \'%ls\' cannot be loaded.";
      goto LAB_001253bf;
    }
    unloadKeymap(this);
    this->m_keymap = pMVar4;
    this->m_keymap_size = qmap_keymap_size;
    this->m_keycompose = pCVar5;
    this->m_keycompose_size = qmap_keycompose_size;
    this->m_do_compose = true;
    bVar6 = true;
  }
  else {
    local_98[0] = '\x02';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    local_80 = "default";
    uVar2 = QString::utf16();
    pcVar8 = "\'%ls\' is not a valid .qmap keymap file";
LAB_001253bf:
    bVar6 = false;
    QMessageLogger::warning(local_98,pcVar8,uVar2);
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
LAB_001252cb:
  QFile::~QFile((QFile *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QEvdevKeyboardHandler::loadKeymap(const QString &file)
{
    qCDebug(qLcEvdevKey, "Loading keymap %ls", qUtf16Printable(file));

    QFile f(file);

    if (!f.open(QIODevice::ReadOnly)) {
        qWarning("Could not open keymap file '%ls'", qUtf16Printable(file));
        return false;
    }

    // .qmap files have a very simple structure:
    // quint32 magic           (QKeyboard::FileMagic)
    // quint32 version         (1)
    // quint32 keymap_size     (# of struct QKeyboard::Mappings)
    // quint32 keycompose_size (# of struct QKeyboard::Composings)
    // all QKeyboard::Mappings via QDataStream::operator(<<|>>)
    // all QKeyboard::Composings via QDataStream::operator(<<|>>)

    quint32 qmap_magic, qmap_version, qmap_keymap_size, qmap_keycompose_size;

    QDataStream ds(&f);

    ds >> qmap_magic >> qmap_version >> qmap_keymap_size >> qmap_keycompose_size;

    if (ds.status() != QDataStream::Ok || qmap_magic != QKeyboardMap::FileMagic || qmap_version != 1 || qmap_keymap_size == 0) {
        qWarning("'%ls' is not a valid .qmap keymap file", qUtf16Printable(file));
        return false;
    }

    QKeyboardMap::Mapping *qmap_keymap = new QKeyboardMap::Mapping[qmap_keymap_size];
    QKeyboardMap::Composing *qmap_keycompose = qmap_keycompose_size ? new QKeyboardMap::Composing[qmap_keycompose_size] : 0;

    for (quint32 i = 0; i < qmap_keymap_size; ++i)
        ds >> qmap_keymap[i];
    for (quint32 i = 0; i < qmap_keycompose_size; ++i)
        ds >> qmap_keycompose[i];

    if (ds.status() != QDataStream::Ok) {
        delete [] qmap_keymap;
        delete [] qmap_keycompose;

        qWarning("Keymap file '%ls' cannot be loaded.", qUtf16Printable(file));
        return false;
    }

    // unload currently active and clear state
    unloadKeymap();

    m_keymap = qmap_keymap;
    m_keymap_size = qmap_keymap_size;
    m_keycompose = qmap_keycompose;
    m_keycompose_size = qmap_keycompose_size;

    m_do_compose = true;

    return true;
}